

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O1

int archive_read_format_cpio_bid(archive_read *a,int best_bid)

{
  void *pvVar1;
  int *piVar2;
  int iVar3;
  code *pcVar4;
  
  pvVar1 = a->format->data;
  piVar2 = (int *)__archive_read_ahead(a,6,(ssize_t *)0x0);
  if (piVar2 == (int *)0x0) {
    iVar3 = -1;
  }
  else {
    iVar3 = 0x30;
    pcVar4 = header_odc;
    if (((((short)piVar2[1] != 0x3730 || *piVar2 != 0x37303730) &&
         ((short)piVar2[1] != 0x3732 || *piVar2 != 0x37303730)) &&
        (pcVar4 = header_newc, (short)piVar2[1] != 0x3130 || *piVar2 != 0x37303730)) &&
       ((short)piVar2[1] != 0x3230 || *piVar2 != 0x37303730)) {
      iVar3 = 0x10;
      if (CONCAT11((char)*piVar2,*(undefined1 *)((long)piVar2 + 1)) == 0x71c7) {
        pcVar4 = header_bin_be;
      }
      else {
        if ((short)*piVar2 != 0x71c7) {
          return -0x14;
        }
        pcVar4 = header_bin_le;
      }
    }
    *(code **)((long)pvVar1 + 8) = pcVar4;
  }
  return iVar3;
}

Assistant:

static int
archive_read_format_cpio_bid(struct archive_read *a, int best_bid)
{
	const unsigned char *p;
	struct cpio *cpio;
	int bid;

	(void)best_bid; /* UNUSED */

	cpio = (struct cpio *)(a->format->data);

	if ((p = __archive_read_ahead(a, 6, NULL)) == NULL)
		return (-1);

	bid = 0;
	if (memcmp(p, "070707", 6) == 0) {
		/* ASCII cpio archive (odc, POSIX.1) */
		cpio->read_header = header_odc;
		bid += 48;
		/*
		 * XXX TODO:  More verification; Could check that only octal
		 * digits appear in appropriate header locations. XXX
		 */
	} else if (memcmp(p, "070727", 6) == 0) {
		/* afio large ASCII cpio archive */
		cpio->read_header = header_odc;
		bid += 48;
		/*
		 * XXX TODO:  More verification; Could check that almost hex
		 * digits appear in appropriate header locations. XXX
		 */
	} else if (memcmp(p, "070701", 6) == 0) {
		/* ASCII cpio archive (SVR4 without CRC) */
		cpio->read_header = header_newc;
		bid += 48;
		/*
		 * XXX TODO:  More verification; Could check that only hex
		 * digits appear in appropriate header locations. XXX
		 */
	} else if (memcmp(p, "070702", 6) == 0) {
		/* ASCII cpio archive (SVR4 with CRC) */
		/* XXX TODO: Flag that we should check the CRC. XXX */
		cpio->read_header = header_newc;
		bid += 48;
		/*
		 * XXX TODO:  More verification; Could check that only hex
		 * digits appear in appropriate header locations. XXX
		 */
	} else if (p[0] * 256 + p[1] == 070707) {
		/* big-endian binary cpio archives */
		cpio->read_header = header_bin_be;
		bid += 16;
		/* Is more verification possible here? */
	} else if (p[0] + p[1] * 256 == 070707) {
		/* little-endian binary cpio archives */
		cpio->read_header = header_bin_le;
		bid += 16;
		/* Is more verification possible here? */
	} else
		return (ARCHIVE_WARN);

	return (bid);
}